

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O1

void pvip_free(pvip_t *pvip)

{
  pvip_arena *ppVar1;
  pvip_arena *__ptr;
  PVIP_category_t PVar2;
  long lVar3;
  _PVIPNode ***ppp_Var4;
  
  __ptr = pvip->arena;
  while (__ptr != (pvip_arena *)0x0) {
    if (0 < __ptr->idx) {
      ppp_Var4 = &__ptr->nodes[0].field_2.children.nodes;
      lVar3 = 0;
      do {
        PVar2 = PVIP_node_category(*(PVIP_node_type_t *)(ppp_Var4 + -2));
        if (PVar2 == PVIP_CATEGORY_STRING) {
          PVIP_string_destroy(*(PVIPString **)(ppp_Var4 + -1));
        }
        else if (PVar2 == PVIP_CATEGORY_CHILDREN) {
          free(*ppp_Var4);
        }
        lVar3 = lVar3 + 1;
        ppp_Var4 = ppp_Var4 + 3;
      } while (lVar3 < __ptr->idx);
    }
    ppVar1 = __ptr->next;
    free(__ptr);
    __ptr = ppVar1;
  }
  free(pvip);
  return;
}

Assistant:

void pvip_free(struct pvip_t* pvip) {
    struct pvip_arena* arena = pvip->arena;
    while (arena) {
        int i;
        for (i=0; i<arena->idx; ++i) {
            PVIPNode* node = &(arena->nodes[i]);
            switch (PVIP_node_category(node->type)) {
            case PVIP_CATEGORY_CHILDREN:
                free(node->children.nodes);
                break;
            case PVIP_CATEGORY_STRING:
                PVIP_string_destroy(node->pv);
                break;
            case PVIP_CATEGORY_UNKNOWN:
            case PVIP_CATEGORY_INT:
            case PVIP_CATEGORY_NUMBER:
                break; // nop
            }
        }
        struct pvip_arena* next =  arena->next;
        free(arena);
        arena = next;
    }
    free(pvip);
}